

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O2

void __thiscall CNetAddr::SerializeV1Array(CNetAddr *this,uint8_t (*arr) [16])

{
  uint uVar1;
  long lVar2;
  CNetAddr *__src;
  uint uVar3;
  uint8_t *__dest;
  long in_FS_OFFSET;
  undefined4 uVar4;
  undefined4 uVar5;
  size_type sVar6;
  undefined4 uVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->m_net) {
  case NET_UNROUTABLE:
  case NET_MAX:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.h"
                  ,0x15f,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
  case NET_IPV4:
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
    }
    if (uVar3 != 4) {
      __assert_fail("prefix_size + m_addr.size() == sizeof(arr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.h"
                    ,0x14f,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
    }
    *(uint8_t *)((long)arr + 0) = '\0';
    *(uint8_t *)((long)arr + 1) = '\0';
    *(uint8_t *)((long)arr + 2) = '\0';
    *(uint8_t *)((long)arr + 3) = '\0';
    *(uint8_t *)((long)arr + 4) = '\0';
    *(uint8_t *)((long)arr + 5) = '\0';
    *(uint8_t *)((long)arr + 6) = '\0';
    *(uint8_t *)((long)arr + 7) = '\0';
    *(uint8_t *)((long)arr + 8) = '\0';
    *(uint8_t *)((long)arr + 9) = '\0';
    *(uint8_t *)((long)arr + 10) = 0xff;
    *(uint8_t *)((long)arr + 0xb) = 0xff;
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    __src = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
      __src = this;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __dest = *arr + 0xc;
LAB_001c18f8:
      memcpy(__dest,__src,(ulong)uVar3);
      return;
    }
    break;
  case NET_IPV6:
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
    }
    if (uVar3 != 0x10) {
      __assert_fail("m_addr.size() == sizeof(arr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.h"
                    ,0x14a,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
    }
    if (0x10 < uVar1) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      uVar4 = *(undefined4 *)&(this->m_addr)._union;
      uVar5 = *(undefined4 *)((long)&(this->m_addr)._union + 4);
      sVar6 = (this->m_addr)._union.indirect_contents.capacity;
      uVar7 = *(undefined4 *)((long)&(this->m_addr)._union + 0xc);
LAB_001c18b1:
      *(undefined4 *)*arr = uVar4;
      *(undefined4 *)(*arr + 4) = uVar5;
      *(size_type *)(*arr + 8) = sVar6;
      *(undefined4 *)(*arr + 0xc) = uVar7;
      return;
    }
    break;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      uVar4 = 0;
      uVar5 = 0;
      sVar6 = 0;
      uVar7 = 0;
      goto LAB_001c18b1;
    }
    break;
  case NET_INTERNAL:
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
    }
    if (uVar3 != 10) {
      __assert_fail("prefix_size + m_addr.size() == sizeof(arr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.h"
                    ,0x155,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
    }
    *(uint8_t *)((long)arr + 4) = 0x87;
    *(uint8_t *)((long)arr + 5) = '$';
    *(uint8_t *)((long)arr + 0) = 0xfd;
    *(uint8_t *)((long)arr + 1) = 'k';
    *(uint8_t *)((long)arr + 2) = 0x88;
    *(uint8_t *)((long)arr + 3) = 0xc0;
    uVar1 = (this->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    __src = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
      __src = this;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __dest = *arr + 6;
      goto LAB_001c18f8;
    }
  }
  __stack_chk_fail();
}

Assistant:

void SerializeV1Array(uint8_t (&arr)[V1_SERIALIZATION_SIZE]) const
    {
        size_t prefix_size;

        switch (m_net) {
        case NET_IPV6:
            assert(m_addr.size() == sizeof(arr));
            memcpy(arr, m_addr.data(), m_addr.size());
            return;
        case NET_IPV4:
            prefix_size = sizeof(IPV4_IN_IPV6_PREFIX);
            assert(prefix_size + m_addr.size() == sizeof(arr));
            memcpy(arr, IPV4_IN_IPV6_PREFIX.data(), prefix_size);
            memcpy(arr + prefix_size, m_addr.data(), m_addr.size());
            return;
        case NET_INTERNAL:
            prefix_size = sizeof(INTERNAL_IN_IPV6_PREFIX);
            assert(prefix_size + m_addr.size() == sizeof(arr));
            memcpy(arr, INTERNAL_IN_IPV6_PREFIX.data(), prefix_size);
            memcpy(arr + prefix_size, m_addr.data(), m_addr.size());
            return;
        case NET_ONION:
        case NET_I2P:
        case NET_CJDNS:
            break;
        case NET_UNROUTABLE:
        case NET_MAX:
            assert(false);
        } // no default case, so the compiler can warn about missing cases

        // Serialize ONION, I2P and CJDNS as all-zeros.
        memset(arr, 0x0, V1_SERIALIZATION_SIZE);
    }